

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O1

extrapolation_t *
tchecker::zg::extrapolation_factory
          (extrapolation_type_t extrapolation_type,clockbounds_t *clock_bounds)

{
  extrapolation_t *peVar1;
  local_lu_extrapolation_t *this;
  undefined **ppuVar2;
  invalid_argument *this_00;
  shared_ptr<const_tchecker::clockbounds::local_lu_map_t> local_20;
  
  switch(extrapolation_type) {
  case NO_EXTRAPOLATION:
    peVar1 = (extrapolation_t *)operator_new(8);
    peVar1->_vptr_extrapolation_t = (_func_int **)&PTR__extrapolation_t_0021d1d0;
    return peVar1;
  case EXTRA_LU_GLOBAL:
    this = (local_lu_extrapolation_t *)operator_new(0x18);
    clockbounds::clockbounds_t::global_lu_map(clock_bounds);
    (this->super_extrapolation_t)._vptr_extrapolation_t =
         (_func_int **)&PTR__global_lu_extrapolation_t_0021d158;
    this->_l = (map_t *)local_20.
                        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
    this->_u = (map_t *)local_20.
                        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
    if (local_20.
        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20.
         super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_20.
              super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20.
         super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_20.
              super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ppuVar2 = &PTR__global_lu_extrapolation_t_0021d210;
    break;
  case EXTRA_LU_LOCAL:
    this = (local_lu_extrapolation_t *)operator_new(0x28);
    clockbounds::clockbounds_t::local_lu_map(clock_bounds);
    details::local_lu_extrapolation_t::local_lu_extrapolation_t(this,&local_20);
    ppuVar2 = &PTR__local_lu_extrapolation_t_0021d2a8;
    break;
  case EXTRA_LU_PLUS_GLOBAL:
    this = (local_lu_extrapolation_t *)operator_new(0x18);
    clockbounds::clockbounds_t::global_lu_map(clock_bounds);
    (this->super_extrapolation_t)._vptr_extrapolation_t =
         (_func_int **)&PTR__global_lu_extrapolation_t_0021d158;
    this->_l = (map_t *)local_20.
                        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
    this->_u = (map_t *)local_20.
                        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
    if (local_20.
        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20.
         super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_20.
              super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20.
         super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_20.
              super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ppuVar2 = &PTR__global_lu_extrapolation_t_0021d250;
    break;
  case EXTRA_LU_PLUS_LOCAL:
    this = (local_lu_extrapolation_t *)operator_new(0x28);
    clockbounds::clockbounds_t::local_lu_map(clock_bounds);
    details::local_lu_extrapolation_t::local_lu_extrapolation_t(this,&local_20);
    ppuVar2 = &PTR__local_lu_extrapolation_t_0021d2e8;
    break;
  case EXTRA_M_GLOBAL:
    this = (local_lu_extrapolation_t *)operator_new(0x18);
    clockbounds::clockbounds_t::global_m_map(clock_bounds);
    (this->super_extrapolation_t)._vptr_extrapolation_t =
         (_func_int **)&PTR__global_m_extrapolation_t_0021d440;
    this->_l = (map_t *)local_20.
                        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
    this->_u = (map_t *)local_20.
                        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
    if (local_20.
        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20.
         super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_20.
              super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20.
         super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_20.
              super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ppuVar2 = &PTR__global_m_extrapolation_t_0021d328;
    break;
  case EXTRA_M_LOCAL:
    this = (local_lu_extrapolation_t *)operator_new(0x20);
    clockbounds::clockbounds_t::local_m_map(clock_bounds);
    details::local_m_extrapolation_t::local_m_extrapolation_t
              ((local_m_extrapolation_t *)this,
               (shared_ptr<const_tchecker::clockbounds::local_m_map_t> *)&local_20);
    ppuVar2 = &PTR__local_m_extrapolation_t_0021d3c0;
    break;
  case EXTRA_M_PLUS_GLOBAL:
    this = (local_lu_extrapolation_t *)operator_new(0x18);
    clockbounds::clockbounds_t::global_m_map(clock_bounds);
    (this->super_extrapolation_t)._vptr_extrapolation_t =
         (_func_int **)&PTR__global_m_extrapolation_t_0021d440;
    this->_l = (map_t *)local_20.
                        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
    this->_u = (map_t *)local_20.
                        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
    if (local_20.
        super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20.
         super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_20.
              super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20.
         super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_20.
              super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ppuVar2 = &PTR__global_m_extrapolation_t_0021d368;
    break;
  case EXTRA_M_PLUS_LOCAL:
    this = (local_lu_extrapolation_t *)operator_new(0x20);
    clockbounds::clockbounds_t::local_m_map(clock_bounds);
    details::local_m_extrapolation_t::local_m_extrapolation_t
              ((local_m_extrapolation_t *)this,
               (shared_ptr<const_tchecker::clockbounds::local_m_map_t> *)&local_20);
    ppuVar2 = &PTR__local_m_extrapolation_t_0021d400;
    break;
  default:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Unknown zone extrapolation");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (this->super_extrapolation_t)._vptr_extrapolation_t = (_func_int **)ppuVar2;
  if (local_20.
      super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<const_tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return &this->super_extrapolation_t;
}

Assistant:

tchecker::zg::extrapolation_t * extrapolation_factory(enum extrapolation_type_t extrapolation_type,
                                                      tchecker::clockbounds::clockbounds_t const & clock_bounds)
{
  if (extrapolation_type == tchecker::zg::NO_EXTRAPOLATION)
    return new tchecker::zg::no_extrapolation_t;
  switch (extrapolation_type) {
  case tchecker::zg::EXTRA_LU_GLOBAL:
    return new tchecker::zg::global_extra_lu_t{clock_bounds.global_lu_map()};
  case tchecker::zg::EXTRA_LU_LOCAL:
    return new tchecker::zg::local_extra_lu_t{clock_bounds.local_lu_map()};
  case tchecker::zg::EXTRA_LU_PLUS_GLOBAL:
    return new tchecker::zg::global_extra_lu_plus_t{clock_bounds.global_lu_map()};
  case tchecker::zg::EXTRA_LU_PLUS_LOCAL:
    return new tchecker::zg::local_extra_lu_plus_t{clock_bounds.local_lu_map()};
  case tchecker::zg::EXTRA_M_GLOBAL:
    return new tchecker::zg::global_extra_m_t{clock_bounds.global_m_map()};
  case tchecker::zg::EXTRA_M_LOCAL:
    return new tchecker::zg::local_extra_m_t{clock_bounds.local_m_map()};
  case tchecker::zg::EXTRA_M_PLUS_GLOBAL:
    return new tchecker::zg::global_extra_m_plus_t{clock_bounds.global_m_map()};
  case tchecker::zg::EXTRA_M_PLUS_LOCAL:
    return new tchecker::zg::local_extra_m_plus_t{clock_bounds.local_m_map()};
  default:
    throw std::invalid_argument("Unknown zone extrapolation");
  }
}